

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-context.cpp
# Opt level: O0

size_t __thiscall
llama_context::state_seq_save_file
          (llama_context *this,llama_seq_id seq_id,char *filepath,llama_token *tokens,
          size_t n_token_count)

{
  llama_io_write_file *this_00;
  size_t sVar1;
  long in_R8;
  size_t res;
  llama_io_write_file io;
  llama_file file;
  undefined4 in_stack_ffffffffffffff48;
  uint32_t in_stack_ffffffffffffff4c;
  llama_context *in_stack_ffffffffffffff50;
  llama_io_write_file local_70;
  long local_28;
  
  local_28 = in_R8;
  llama_file::llama_file
            ((llama_file *)in_stack_ffffffffffffff50,
             (char *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48),(char *)0x3e0a1c)
  ;
  llama_file::write_u32((llama_file *)in_stack_ffffffffffffff50,in_stack_ffffffffffffff4c);
  llama_file::write_u32((llama_file *)in_stack_ffffffffffffff50,in_stack_ffffffffffffff4c);
  llama_file::write_u32((llama_file *)in_stack_ffffffffffffff50,in_stack_ffffffffffffff4c);
  llama_file::write_raw
            ((llama_file *)in_stack_ffffffffffffff50,
             (void *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48),0x3e0a78);
  llama_io_write_file::llama_io_write_file
            ((llama_io_write_file *)in_stack_ffffffffffffff50,
             (llama_file *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
  state_seq_write_data
            (in_stack_ffffffffffffff50,
             (llama_io_write_i *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48),0);
  this_00 = (llama_io_write_file *)llama_file::tell((llama_file *)0x3e0ab3);
  sVar1 = llama_io_write_file::n_bytes(&local_70);
  if (this_00 != (llama_io_write_file *)(local_28 * 4 + 0xc + sVar1)) {
    ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/src/llama-context.cpp"
               ,0x7df,"GGML_ASSERT(%s) failed",
               "res == sizeof(uint32_t) * 3 + sizeof(llama_token) * n_token_count + io.n_bytes()");
  }
  llama_io_write_file::~llama_io_write_file(this_00);
  llama_file::~llama_file((llama_file *)0x3e0b7f);
  return (size_t)this_00;
}

Assistant:

size_t llama_context::state_seq_save_file(llama_seq_id seq_id, const char * filepath, const llama_token * tokens, size_t n_token_count) {
    llama_file file(filepath, "wb");

    file.write_u32(LLAMA_STATE_SEQ_MAGIC);
    file.write_u32(LLAMA_STATE_SEQ_VERSION);

    // save the prompt
    file.write_u32((uint32_t) n_token_count);
    file.write_raw(tokens, sizeof(llama_token) * n_token_count);

    // save the context state using stream saving
    llama_io_write_file io(&file);
    state_seq_write_data(io, seq_id);

    const size_t res = file.tell();
    GGML_ASSERT(res == sizeof(uint32_t) * 3 + sizeof(llama_token) * n_token_count + io.n_bytes());

    return res;
}